

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_framework.cpp
# Opt level: O0

void __thiscall PerformanceTestFramework::run(PerformanceTestFramework *this)

{
  bool bVar1;
  _Setprecision _Var2;
  ostream *poVar3;
  size_type sVar4;
  pointer ppVar5;
  pair<double,_double> pVar6;
  imageException *ex;
  exception *ex_1;
  pair<double,_double> result;
  const_iterator test;
  size_t testId;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  failedFunctionId;
  map<std::pair<double,_double>_(*)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<double,_double>_(*)()>,_std::allocator<std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffec8;
  _Rb_tree_const_iterator<std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffed0;
  _Self local_38;
  _Self local_30;
  ulong local_28;
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x16f16c);
  local_28 = 1;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::pair<double,_double>_(*)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<double,_double>_(*)()>,_std::allocator<std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(in_stack_fffffffffffffec8);
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::pair<double,_double>_(*)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<double,_double>_(*)()>,_std::allocator<std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(in_stack_fffffffffffffec8);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    poVar3 = std::operator<<((ostream *)&std::cout,"[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28);
    poVar3 = std::operator<<(poVar3,"/");
    sVar4 = std::
            map<std::pair<double,_double>_(*)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<double,_double>_(*)()>,_std::allocator<std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size((map<std::pair<double,_double>_(*)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<double,_double>_(*)()>,_std::allocator<std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)0x16f227);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
    poVar3 = std::operator<<(poVar3,"] ");
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x16f26c);
    poVar3 = std::operator<<(poVar3,(string *)&ppVar5->second);
    poVar3 = std::operator<<(poVar3,"... ");
    std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x16f2cb);
    pVar6 = (*ppVar5->first)();
    _Var2 = std::setprecision(4);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pVar6.first);
    poVar3 = std::operator<<(poVar3,"+/-");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pVar6.second * 3.0);
    poVar3 = std::operator<<(poVar3," ms");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_const_iterator<std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(in_stack_fffffffffffffed0);
    local_28 = local_28 + 1;
  }
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x16f663);
  return;
}

Assistant:

void PerformanceTestFramework::run() const
{
    std::list < std::string > failedFunctionId;
    size_t testId = 1;

    for( std::map < testFunction, std::string >::const_iterator test = _performanceTest.begin();
         test != _performanceTest.end(); ++test, ++testId ) {
        std::cout << "["<< testId << "/" << _performanceTest.size() << "] " << test->second << "... " << std::flush;

        try {
            std::pair < double, double > result = (test->first)();

            // We must display 3 sigma value because almost all values would be in this range
            std::cout << std::setprecision( 4 ) << result.first << "+/-" << 3 * result.second << " ms" << std::endl;
        }
        catch( imageException & ex ) {
            failedFunctionId.push_back( test->second );
            std::cout << "ERROR : library exception '" << ex.what() << "' raised" << std::endl;
        }
        catch( std::exception & ex ) {
            failedFunctionId.push_back( test->second );
            std::cout << "ERROR : exception '" << ex.what() << "' raised" << std::endl;
        }
        catch( ... ) {
            failedFunctionId.push_back( test->second );
            std::cout << "ERROR : unknown exception raised" << std::endl;
        }
    }
}